

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall PhPacker_Arg_i_Test::~PhPacker_Arg_i_Test(PhPacker_Arg_i_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhPacker, Arg_i)
{
   auto s = PhPacker::pack('i', 123);
   int res = std::any_cast<int>(PhPacker::unpack('i', s));
   EXPECT_EQ(res, 123);

   std::string str = PhPacker::pack('i', 65535123);
   int result = std::any_cast<int>(PhPacker::unpack('i', str));
   int expected = 65535123;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<int32_t>('i', std::numeric_limits<int32_t>::max());
   result = std::any_cast<int32_t>(PhPacker::unpack('i', str));
   expected = std::numeric_limits<int32_t>::max();
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<int32_t>('i', std::numeric_limits<int32_t>::min());
   result = std::any_cast<int32_t>(PhPacker::unpack('i', str));
   expected = std::numeric_limits<int32_t>::min();
   GTEST_ASSERT_EQ(result, expected);
}